

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

var __thiscall cs::runtime_type::parse_aeq(runtime_type *this,var *a,var *b)

{
  bool bVar1;
  numeric *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  runtime_error *this_02;
  any *in_RSI;
  proxy *in_RDI;
  string *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  type_info *in_stack_ffffffffffffff78;
  allocator *paVar2;
  numeric *in_stack_ffffffffffffff80;
  allocator local_49;
  string local_48 [38];
  undefined1 local_22;
  undefined1 local_21;
  
  cs_impl::any::type((any *)in_stack_ffffffffffffff70);
  bVar1 = std::type_info::operator==
                    ((type_info *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  if (bVar1) {
    cs_impl::any::type((any *)in_stack_ffffffffffffff70);
    bVar1 = std::type_info::operator==
                      ((type_info *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    if (bVar1) {
      this_00 = cs_impl::any::const_val<cs::numeric>(in_RSI);
      cs_impl::any::const_val<cs::numeric>(in_RSI);
      local_21 = numeric::operator>=(this_00,in_stack_ffffffffffffff80);
      cs_impl::any::any<bool>((any *)in_stack_ffffffffffffff80,(bool *)in_stack_ffffffffffffff78);
      return (var)in_RDI;
    }
  }
  cs_impl::any::type((any *)in_stack_ffffffffffffff70);
  bVar1 = std::type_info::operator==
                    ((type_info *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  if (bVar1) {
    cs_impl::any::type((any *)in_stack_ffffffffffffff70);
    bVar1 = std::type_info::operator==
                      ((type_info *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    if (bVar1) {
      this_01 = cs_impl::any::const_val<std::__cxx11::string>(in_RSI);
      cs_impl::any::const_val<std::__cxx11::string>(in_RSI);
      local_22 = std::operator>=(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      cs_impl::any::any<bool>((any *)this_01,(bool *)in_stack_ffffffffffffff78);
      return (var)in_RDI;
    }
  }
  this_02 = (runtime_error *)__cxa_allocate_exception(0x28);
  paVar2 = &local_49;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"Unsupported operator operations(Aeq).",paVar2);
  runtime_error::runtime_error(this_02,in_stack_ffffffffffffff68);
  __cxa_throw(this_02,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

var runtime_type::parse_aeq(const var &a, const var &b)
	{
		if (a.type() == typeid(numeric) && b.type() == typeid(numeric))
			return boolean(a.const_val<numeric>() >= b.const_val<numeric>());
		else if (a.type() == typeid(string) && b.type() == typeid(string))
			return boolean(a.const_val<string>() >= b.const_val<string>());
		else
			throw runtime_error("Unsupported operator operations(Aeq).");
	}